

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::~XMLNode(XMLNode *this)

{
  code *pcVar1;
  XMLNode *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

XMLNode::~XMLNode()
{
    DeleteChildren();
    if (_parent) {
        _parent->Unlink(this);
    }
}